

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::yarn4>(size_t samples,unsigned_long seed)

{
  parameter_type P;
  int iVar1;
  result_type rVar2;
  result_type rVar3;
  ostream *poVar4;
  yarn4 *this;
  char *pcVar5;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  yarn4 r;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  ulong local_48;
  
  P.a[1] = in_stack_ffffffffffffff9c;
  P.a[0] = in_stack_ffffffffffffff98;
  P.a._8_8_ = in_stack_ffffffffffffffa0;
  trng::yarn4::yarn4((yarn4 *)0x10b52a,P);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  this = (yarn4 *)std::operator<<(poVar4,"# generator ");
  pcVar5 = trng::yarn4::name();
  poVar4 = std::operator<<((ostream *)this,pcVar5);
  poVar4 = std::operator<<(poVar4,"  seed = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RSI);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "#==================================================================\n");
  poVar4 = std::operator<<(poVar4,"type: d\n");
  poVar4 = std::operator<<(poVar4,"count: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"numbit: ");
  trng::yarn4::max();
  trng::yarn4::min();
  iVar1 = trng::int_math::log2_ceil<int>(0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  std::operator<<(poVar4,'\n');
  for (local_48 = 0; local_48 < in_RDI; local_48 = local_48 + 1) {
    rVar2 = trng::yarn4::operator()(this);
    rVar3 = trng::yarn4::min();
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar2 - rVar3);
    std::operator<<(poVar4,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}